

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall cmake::Generate(cmake *this)

{
  bool bVar1;
  ostream *poVar2;
  string *path;
  int iVar3;
  
  iVar3 = -1;
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    bVar1 = cmGlobalGenerator::Compute(this->GlobalGenerator);
    if (bVar1) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xd])();
      if ((this->GraphVizFile)._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Generate graphviz: ",0x13);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(this->GraphVizFile)._M_dataplus._M_p,
                            (this->GraphVizFile)._M_string_length);
        std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        GenerateGraphViz(this,(this->GraphVizFile)._M_dataplus._M_p);
      }
      if (this->WarnUnusedCli == true) {
        RunCheckForUnusedVariables(this);
      }
      if ((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false))
      {
        bVar1 = cmSystemTools::GetInterruptFlag();
        if (!bVar1) {
          path = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
          SaveCache(this,path);
          cmFileAPI::WriteReplies
                    ((this->FileAPI)._M_t.
                     super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
                     super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
                     super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl);
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int cmake::Generate()
{
  if (!this->GlobalGenerator) {
    return -1;
  }
  if (!this->GlobalGenerator->Compute()) {
    return -1;
  }
  this->GlobalGenerator->Generate();
  if (!this->GraphVizFile.empty()) {
    std::cout << "Generate graphviz: " << this->GraphVizFile << std::endl;
    this->GenerateGraphViz(this->GraphVizFile.c_str());
  }
  if (this->WarnUnusedCli) {
    this->RunCheckForUnusedVariables();
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  // Save the cache again after a successful Generate so that any internal
  // variables created during Generate are saved. (Specifically target GUIDs
  // for the Visual Studio and Xcode generators.)
  this->SaveCache(this->GetHomeOutputDirectory());

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->FileAPI->WriteReplies();
#endif

  return 0;
}